

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O2

void __thiscall
event_track::ingest_event_stream::write_to_dash_event_stream
          (ingest_event_stream *this,string *out_file)

{
  int iVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  _Self __tmp;
  string scheme_id_uri;
  string local_250;
  ofstream ot;
  int aiStack_210 [120];
  
  std::ofstream::ofstream(&ot,(string *)out_file,_S_out);
  if (*(int *)((long)aiStack_210 + *(long *)(_ot + -0x18)) == 0) {
    fmp4_stream::init_fragment::get_time_scale((init_fragment *)this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&scheme_id_uri,"",(allocator<char> *)&local_250);
    for (p_Var4 = *(_Rb_tree_node_base **)&this->field_0x238;
        p_Var4 != (_Rb_tree_node_base *)&this->field_0x228;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      std::__cxx11::string::_M_assign((string *)&scheme_id_uri);
      poVar2 = std::operator<<((ostream *)&ot,"<EventStream ");
      std::endl<char,std::char_traits<char>>(poVar2);
      iVar1 = std::__cxx11::string::compare((char *)&scheme_id_uri);
      if (iVar1 == 0) {
        poVar2 = std::operator<<((ostream *)&ot,"schemeIdUri=");
        poVar2 = std::operator<<(poVar2,'\"');
        poVar2 = std::operator<<(poVar2,"urn:scte:scte35:2014:xml+bin");
      }
      else {
        poVar2 = std::operator<<((ostream *)&ot,"schemeIdUri=");
        poVar2 = std::operator<<(poVar2,'\"');
        poVar2 = std::operator<<(poVar2,(string *)&scheme_id_uri);
      }
      poVar2 = std::operator<<(poVar2,'\"');
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<((ostream *)&ot," timescale=");
      poVar2 = std::operator<<(poVar2,'\"');
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,'\"');
      poVar2 = std::operator<<(poVar2,">");
      std::endl<char,std::char_traits<char>>(poVar2);
      for (p_Var3 = p_Var4[2]._M_right; p_Var3 != (_Base_ptr)&p_Var4[2]._M_parent;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
        poVar2 = std::operator<<((ostream *)&std::cout," writing an event to output ");
        std::endl<char,std::char_traits<char>>(poVar2);
        poVar2 = std::operator<<((ostream *)&ot,"<Event ");
        poVar2 = std::operator<<(poVar2,"presentationTime=");
        poVar2 = std::operator<<(poVar2,'\"');
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        poVar2 = std::operator<<(poVar2,'\"');
        poVar2 = std::operator<<(poVar2," ");
        poVar2 = std::operator<<(poVar2,"duration=");
        poVar2 = std::operator<<(poVar2,'\"');
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        poVar2 = std::operator<<(poVar2,'\"');
        poVar2 = std::operator<<(poVar2," ");
        poVar2 = std::operator<<(poVar2,"id=");
        poVar2 = std::operator<<(poVar2,'\"');
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::operator<<(poVar2,'\"');
        iVar1 = std::__cxx11::string::compare((char *)&p_Var3[5]._M_parent);
        if (iVar1 == 0) {
          poVar2 = std::operator<<((ostream *)&ot,'>');
          poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
          poVar2 = std::operator<<(poVar2,"  <Signal xmlns=");
          poVar2 = std::operator<<(poVar2,'\"');
          poVar2 = std::operator<<(poVar2,"http://www.scte.org/schemas/35/2016");
          poVar2 = std::operator<<(poVar2,'\"');
          poVar2 = std::operator<<(poVar2,'>');
          poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
          poVar2 = std::operator<<(poVar2,"    <Binary>");
          base64_encode_abi_cxx11_
                    (&local_250,(uchar *)p_Var3[7]._M_parent,
                     (ulong)(uint)(*(int *)&p_Var3[7]._M_left - (int)p_Var3[7]._M_parent));
          poVar2 = std::operator<<(poVar2,(string *)&local_250);
          poVar2 = std::operator<<(poVar2,"</Binary>");
          poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
          poVar2 = std::operator<<(poVar2,"  </Signal>");
          std::endl<char,std::char_traits<char>>(poVar2);
        }
        else {
          poVar2 = std::operator<<((ostream *)&ot," ");
          poVar2 = std::operator<<(poVar2,"contentEncoding=");
          poVar2 = std::operator<<(poVar2,'\"');
          poVar2 = std::operator<<(poVar2,"base64");
          poVar2 = std::operator<<(poVar2,'\"');
          poVar2 = std::operator<<(poVar2,'>');
          poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
          base64_encode_abi_cxx11_
                    (&local_250,(uchar *)p_Var3[7]._M_parent,
                     (ulong)(uint)(*(int *)&p_Var3[7]._M_left - (int)p_Var3[7]._M_parent));
          poVar2 = std::operator<<(poVar2,(string *)&local_250);
          std::endl<char,std::char_traits<char>>(poVar2);
        }
        std::__cxx11::string::~string((string *)&local_250);
        poVar2 = std::operator<<((ostream *)&ot,"</Event>");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
    }
    poVar2 = std::operator<<((ostream *)&ot,"</EventStream> ");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&scheme_id_uri);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&ot);
  return;
}

Assistant:

void event_track::ingest_event_stream::write_to_dash_event_stream(std::string &out_file)
{
	std::ofstream ot(out_file);

	if (ot.good()) {

		uint32_t time_scale = init_fragment_.get_time_scale();
		std::string scheme_id_uri = "";

		for (auto it = this->events_list_.begin(); it != this->events_list_.end(); ++it)
		{
			scheme_id_uri = it->first;
			ot << "<EventStream " << std::endl;
			if (scheme_id_uri.compare("urn:scte:scte35:2013:bin") == 0) // convert binary scte 214 to xml + bin
			{
				ot << "schemeIdUri=" << '"' << "urn:scte:scte35:2014:xml+bin" << '"' << std::endl;
			}
			else {
				ot << "schemeIdUri=" << '"' << scheme_id_uri << '"' << std::endl;
			}
			ot << " timescale=" << '"' << time_scale << '"' << ">" << std::endl;

			// write each of the event messages as moof mdat combinations in sparse track 
			for (auto it2 = it->second.begin(); it2 != it->second.end(); it2++)
			{
				std::cout << " writing an event to output " << std::endl;
				ot << "<Event "
					<< "presentationTime=" << '"' << it2->second.presentation_time_ << '"' << " "  \
					<< "duration=" << '"' << it2->second.event_duration_<< '"' << " "  \
					<< "id=" << '"' << it2->second.id_ << '"';
				if (it2->second.scheme_id_uri_.compare("urn:scte:scte35:2013:bin") == 0) // write binary scte as xml + bin as defined by scte-35
				{
					ot << '>' << std::endl << "  <Signal xmlns=" << '"' << "http://www.scte.org/schemas/35/2016" << '"' << '>' << std::endl \
						<< "    <Binary>" << base64_encode(it2->second.message_data_.data(), (unsigned int) it2->second.message_data_.size()) << "</Binary>" << std::endl
						<< "  </Signal>" << std::endl;
				}
				else {
					ot << " " << "contentEncoding=" << '"' << "base64" << '"' << '>' << std::endl
						<< base64_encode(it2->second.message_data_.data(), (unsigned int)it2->second.message_data_.size()) << std::endl;
				}
				ot << "</Event>" << std::endl;
			}
			}
			ot << "</EventStream> " << std::endl;
		}

	    ot.close();
	}